

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> * __thiscall
cfd::core::Transaction::GetTxInList
          (vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
           *__return_storage_ptr__,Transaction *this)

{
  pointer pTVar1;
  pointer pTVar2;
  TxIn tx_in;
  AbstractTxInReference AStack_148;
  AbstractTxIn local_b8;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar2 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    TxIn::TxIn((TxIn *)&local_b8,pTVar2);
    TxInReference::TxInReference((TxInReference *)&AStack_148,(TxIn *)&local_b8);
    ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
    emplace_back<cfd::core::TxInReference>(__return_storage_ptr__,(TxInReference *)&AStack_148);
    AbstractTxInReference::~AbstractTxInReference(&AStack_148);
    AbstractTxIn::~AbstractTxIn(&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<TxInReference> Transaction::GetTxInList() const {
  std::vector<TxInReference> refs;
  for (TxIn tx_in : vin_) {
    refs.push_back(TxInReference(tx_in));
  }
  return refs;
}